

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cpp
# Opt level: O0

bool wallet::CreateFromDump
               (ArgsManager *args,string *name,path *wallet_path,bilingual_str *error,
               vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  long lVar1;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  byte bVar2;
  bool bVar3;
  undefined1 uVar4;
  __type_conflict1 _Var5;
  undefined1 uVar6;
  byte bVar7;
  DBErrors DVar8;
  void *pvVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  WalletDatabase *pWVar10;
  pointer pDVar11;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffefd8;
  openmode in_stack_ffffffffffffefdc;
  undefined5 in_stack_ffffffffffffefe0;
  undefined1 in_stack_ffffffffffffefe5;
  undefined1 in_stack_ffffffffffffefe6;
  undefined1 in_stack_ffffffffffffefe7;
  int in_stack_ffffffffffffefe8;
  int iVar12;
  undefined4 in_stack_ffffffffffffefec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeff0;
  undefined4 in_stack_ffffffffffffeff8;
  undefined2 in_stack_ffffffffffffeffc;
  undefined1 in_stack_ffffffffffffeffe;
  undefined1 in_stack_ffffffffffffefff;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffff008;
  string *in_stack_fffffffffffff010;
  ArgsManager *in_stack_fffffffffffff018;
  uint in_stack_fffffffffffff020;
  undefined4 in_stack_fffffffffffff024;
  ConstevalStringLiteral in_stack_fffffffffffff028;
  CWallet *in_stack_fffffffffffff030;
  string *psVar13;
  undefined7 in_stack_fffffffffffff038;
  undefined1 in_stack_fffffffffffff03f;
  ArgsManager *in_stack_fffffffffffff040;
  undefined4 in_stack_fffffffffffff048;
  undefined4 in_stack_fffffffffffff04c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff050;
  bilingual_str *in_stack_fffffffffffff058;
  uchar *puVar14;
  DatabaseOptions *error_00;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *in_stack_fffffffffffff078;
  undefined5 in_stack_fffffffffffff080;
  undefined1 in_stack_fffffffffffff085;
  undefined1 in_stack_fffffffffffff086;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *database_00;
  undefined7 in_stack_fffffffffffff0f8;
  CWallet *this;
  WalletDatabase *db;
  DBErrors load_wallet_ret;
  bool ret;
  int local_df4;
  vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings_local;
  bilingual_str *error_local;
  path *wallet_path_local;
  string *name_local;
  ArgsManager *args_local;
  byte local_da9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> k;
  undefined1 local_d21;
  vector<unsigned_char,_std::allocator<unsigned_char>_> parsed_checksum;
  unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_> batch;
  uchar local_d00 [8];
  shared_ptr<wallet::CWallet> wallet;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> database;
  DatabaseStatus status;
  DatabaseFormat data_format;
  allocator<char> local_cc1 [17];
  uint32_t ver;
  undefined1 local_caa [2];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  uint256 comp_checksum;
  string line;
  string value;
  string key;
  DatabaseOptions options;
  string format_hasher_line;
  string file_format;
  string format_value;
  string format_key;
  string magic_hasher_line;
  string version_value;
  string magic_key;
  uint256 checksum;
  HashWriter hasher;
  ifstream dump_file;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> local_f8 [5];
  path dump_path;
  string dump_filename;
  
  __last._M_current = (uchar *)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff028.lit,
             (char *)CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020),
             (allocator<char> *)in_stack_fffffffffffff018);
  this = (CWallet *)local_caa;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff028.lit,
             (char *)CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020),
             (allocator<char> *)in_stack_fffffffffffff018);
  ArgsManager::GetArg(in_stack_fffffffffffff018,in_stack_fffffffffffff010,
                      (string *)in_stack_fffffffffffff008._M_current);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
  std::allocator<char>::~allocator((allocator<char> *)local_caa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
  std::allocator<char>::~allocator((allocator<char> *)(local_caa + 1));
  bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
  if (bVar3) {
    _(in_stack_fffffffffffff028);
    bilingual_str::operator=
              ((bilingual_str *)CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
               (bilingual_str *)
               CONCAT17(in_stack_ffffffffffffefe7,
                        CONCAT16(in_stack_ffffffffffffefe6,
                                 CONCAT15(in_stack_ffffffffffffefe5,in_stack_ffffffffffffefe0))));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
    local_da9 = 0;
  }
  else {
    fs::PathFromString((string *)in_stack_fffffffffffff008._M_current);
    fs::absolute((path *)in_stack_fffffffffffff008._M_current);
    psVar13 = (string *)&dump_path;
    database_00 = local_f8;
    fs::path::operator=((path *)CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                        (path *)CONCAT17(in_stack_ffffffffffffefe7,
                                         CONCAT16(in_stack_ffffffffffffefe6,
                                                  CONCAT15(in_stack_ffffffffffffefe5,
                                                           in_stack_ffffffffffffefe0))));
    fs::path::~path((path *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
    uVar4 = fs::exists((path *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
    if ((bool)uVar4) {
      std::ifstream::ifstream<fs::path,fs::path>
                ((basic_ifstream<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                 (path *)CONCAT17(in_stack_ffffffffffffefe7,
                                  CONCAT16(in_stack_ffffffffffffefe6,
                                           CONCAT15(in_stack_ffffffffffffefe5,
                                                    in_stack_ffffffffffffefe0))),
                 in_stack_ffffffffffffefdc);
      HashWriter::HashWriter
                ((HashWriter *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
      uint256::uint256((uint256 *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
      std::__cxx11::string::string(in_stack_ffffffffffffeff0);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&dump_file,(string *)&magic_key,',');
      std::__cxx11::string::string(in_stack_ffffffffffffeff0);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&dump_file,(string *)&version_value,'\n');
      _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff008._M_current,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __last._M_current);
      if (((_Var5 ^ 0xffU) & 1) == 0) {
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffefff,
                            CONCAT16(in_stack_ffffffffffffeffe,
                                     CONCAT24(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8)))
                  );
        str._M_str._0_4_ = in_stack_ffffffffffffeff8;
        str._M_len = (size_t)in_stack_ffffffffffffeff0;
        str._M_str._4_2_ = in_stack_ffffffffffffeffc;
        str._M_str._6_1_ = in_stack_ffffffffffffeffe;
        str._M_str._7_1_ = in_stack_ffffffffffffefff;
        bVar3 = ParseUInt32(str,(uint32_t *)
                                CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
        if (bVar3) {
          if (ver == DUMP_VERSION) {
            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                      ((char *)in_stack_fffffffffffff018,in_stack_fffffffffffff010,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff008._M_current);
            Span<char>::Span<std::__cxx11::string>
                      ((Span<char> *)CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffefe7,
                                CONCAT16(in_stack_ffffffffffffefe6,
                                         CONCAT15(in_stack_ffffffffffffefe5,
                                                  in_stack_ffffffffffffefe0))),
                       (type)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
            HashWriter::operator<<
                      ((HashWriter *)CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                       (Span<char> *)
                       CONCAT17(in_stack_ffffffffffffefe7,
                                CONCAT16(in_stack_ffffffffffffefe6,
                                         CONCAT15(in_stack_ffffffffffffefe5,
                                                  in_stack_ffffffffffffefe0))));
            std::__cxx11::string::string(in_stack_ffffffffffffeff0);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&dump_file,(string *)&format_key,',');
            std::__cxx11::string::string(in_stack_ffffffffffffeff0);
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&dump_file,(string *)&format_value,'\n');
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8)
                                    ,(char *)CONCAT17(in_stack_ffffffffffffefe7,
                                                      CONCAT16(in_stack_ffffffffffffefe6,
                                                               CONCAT15(in_stack_ffffffffffffefe5,
                                                                        in_stack_ffffffffffffefe0)))
                                   );
            if (((bVar3 ^ 0xffU) & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff028.lit,
                         (char *)CONCAT44(in_stack_fffffffffffff024,in_stack_fffffffffffff020),
                         (allocator<char> *)in_stack_fffffffffffff018);
              ArgsManager::GetArg(in_stack_fffffffffffff018,in_stack_fffffffffffff010,
                                  (string *)in_stack_fffffffffffff008._M_current);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
              std::allocator<char>::~allocator(local_cc1);
              bVar3 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
              if (bVar3) {
                _(in_stack_fffffffffffff028);
                bilingual_str::operator=
                          ((bilingual_str *)
                           CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                           (bilingual_str *)
                           CONCAT17(in_stack_ffffffffffffefe7,
                                    CONCAT16(in_stack_ffffffffffffefe6,
                                             CONCAT15(in_stack_ffffffffffffefe5,
                                                      in_stack_ffffffffffffefe0))));
                bilingual_str::~bilingual_str
                          ((bilingual_str *)
                           CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
                local_da9 = 0;
              }
              else {
                uVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_ffffffffffffefec,
                                                    in_stack_ffffffffffffefe8),
                                        (char *)CONCAT17(in_stack_ffffffffffffefe7,
                                                         CONCAT16(in_stack_ffffffffffffefe6,
                                                                  CONCAT15(in_stack_ffffffffffffefe5
                                                                           ,
                                                  in_stack_ffffffffffffefe0))));
                local_df4 = in_stack_ffffffffffffefe8;
                if ((((bool)uVar6) ||
                    (in_stack_fffffffffffff086 =
                          std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT44(in_stack_ffffffffffffefec,
                                                      in_stack_ffffffffffffefe8),
                                          (char *)CONCAT17(in_stack_ffffffffffffefe7,
                                                           CONCAT16(in_stack_ffffffffffffefe6,
                                                                    CONCAT15(
                                                  in_stack_ffffffffffffefe5,
                                                  in_stack_ffffffffffffefe0)))),
                    local_df4 = in_stack_ffffffffffffefe8, (bool)in_stack_fffffffffffff086)) ||
                   (in_stack_fffffffffffff085 =
                         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT44(in_stack_ffffffffffffefec,
                                                     in_stack_ffffffffffffefe8),
                                         (char *)CONCAT17(in_stack_ffffffffffffefe7,
                                                          CONCAT16(in_stack_ffffffffffffefe6,
                                                                   CONCAT15(
                                                  in_stack_ffffffffffffefe5,
                                                  in_stack_ffffffffffffefe0)))),
                   local_df4 = in_stack_ffffffffffffefe8, (bool)in_stack_fffffffffffff085)) {
                  _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_fffffffffffff008._M_current,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__last._M_current);
                  if (((_Var5 ^ 0xffU) & 1) != 0) {
                    _(in_stack_fffffffffffff028);
                    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                              (in_stack_fffffffffffff058,in_stack_fffffffffffff050,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT44(in_stack_fffffffffffff04c,in_stack_fffffffffffff048));
                    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::push_back
                              ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)
                               CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8),
                               (value_type *)0x18df76);
                    bilingual_str::~bilingual_str
                              ((bilingual_str *)
                               CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
                    bilingual_str::~bilingual_str
                              ((bilingual_str *)
                               CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
                    in_stack_fffffffffffff078 = warnings;
                  }
                  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                            ((char *)in_stack_fffffffffffff018,in_stack_fffffffffffff010,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff008._M_current);
                  Span<char>::Span<std::__cxx11::string>
                            ((Span<char> *)CONCAT44(in_stack_ffffffffffffefec,local_df4),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_ffffffffffffefe7,
                                      CONCAT16(in_stack_ffffffffffffefe6,
                                               CONCAT15(in_stack_ffffffffffffefe5,
                                                        in_stack_ffffffffffffefe0))),
                             (type)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
                  HashWriter::operator<<
                            ((HashWriter *)CONCAT44(in_stack_ffffffffffffefec,local_df4),
                             (Span<char> *)
                             CONCAT17(in_stack_ffffffffffffefe7,
                                      CONCAT16(in_stack_ffffffffffffefe6,
                                               CONCAT15(in_stack_ffffffffffffefe5,
                                                        in_stack_ffffffffffffefe0))));
                  error_00 = &options;
                  DatabaseOptions::DatabaseOptions
                            ((DatabaseOptions *)
                             CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
                  ReadDatabaseArgs(in_stack_fffffffffffff040,
                                   (DatabaseOptions *)
                                   CONCAT17(in_stack_fffffffffffff03f,in_stack_fffffffffffff038));
                  options.require_create = true;
                  std::optional<wallet::DatabaseFormat>::optional<wallet::DatabaseFormat_&,_true>
                            ((optional<wallet::DatabaseFormat> *)
                             CONCAT44(in_stack_ffffffffffffefec,local_df4),
                             (DatabaseFormat *)
                             CONCAT17(in_stack_ffffffffffffefe7,
                                      CONCAT16(in_stack_ffffffffffffefe6,
                                               CONCAT15(in_stack_ffffffffffffefe5,
                                                        in_stack_ffffffffffffefe0))));
                  MakeDatabase((path *)args,
                               (DatabaseOptions *)
                               CONCAT17(uVar6,CONCAT16(in_stack_fffffffffffff086,
                                                       CONCAT15(in_stack_fffffffffffff085,
                                                                in_stack_fffffffffffff080))),
                               (DatabaseStatus *)in_stack_fffffffffffff078,(bilingual_str *)error_00
                              );
                  bVar3 = std::unique_ptr::operator_cast_to_bool
                                    ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                                      *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8
                                                ));
                  if (bVar3) {
                    bVar2 = 1;
                    pvVar9 = operator_new(0x4a8);
                    puVar14 = local_d00;
                    std::
                    unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                    ::unique_ptr((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                                  *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8),
                                 (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                                  *)0x18e179);
                    CWallet::CWallet(this,(Chain *)CONCAT17(uVar4,in_stack_fffffffffffff0f8),psVar13
                                     ,database_00);
                    std::shared_ptr<wallet::CWallet>::
                    shared_ptr<wallet::CWallet,void(*)(wallet::CWallet*),void>
                              ((shared_ptr<wallet::CWallet> *)
                               CONCAT44(in_stack_ffffffffffffefec,local_df4),
                               (CWallet *)
                               CONCAT17(in_stack_ffffffffffffefe7,
                                        CONCAT16(in_stack_ffffffffffffefe6,
                                                 CONCAT15(in_stack_ffffffffffffefe5,
                                                          in_stack_ffffffffffffefe0))),
                               (_func_void_CWallet_ptr *)
                               CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
                    std::
                    unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                    ::~unique_ptr((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                                   *)CONCAT44(in_stack_ffffffffffffefec,local_df4));
                    std::
                    __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
                    args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                                        ((AnnotatedMixin<std::recursive_mutex> *)
                                         CONCAT44(in_stack_ffffffffffffefdc,
                                                  in_stack_ffffffffffffefd8));
                    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                               in_stack_fffffffffffff018,
                               (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff010,
                               (char *)in_stack_fffffffffffff008._M_current,
                               (char *)__last._M_current,
                               CONCAT13(in_stack_ffffffffffffefff,
                                        CONCAT12(in_stack_ffffffffffffeffe,in_stack_ffffffffffffeffc
                                                )),SUB41((uint)in_stack_ffffffffffffeff8 >> 0x18,0))
                    ;
                    std::
                    __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
                    DVar8 = CWallet::LoadWallet(in_stack_fffffffffffff030);
                    if (DVar8 == LOAD_OK) {
                      std::
                      __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8))
                      ;
                      pWVar10 = CWallet::GetDatabase
                                          ((CWallet *)CONCAT44(in_stack_ffffffffffffefec,local_df4))
                      ;
                      (*pWVar10->_vptr_WalletDatabase[0xe])(&batch,pWVar10,1);
                      pDVar11 = std::
                                unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                ::operator->((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                              *)CONCAT44(in_stack_ffffffffffffefdc,
                                                         in_stack_ffffffffffffefd8));
                      (*pDVar11->_vptr_DatabaseBatch[0xb])();
                      iVar12 = local_df4;
                      do {
                        bVar7 = std::ios::good();
                        local_df4 = iVar12;
                        if ((bVar7 & 1) == 0) break;
                        psVar13 = &key;
                        std::__cxx11::string::string(in_stack_ffffffffffffeff0);
                        std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)&dump_file,(string *)psVar13,',');
                        in_stack_fffffffffffff028.lit = (char *)&value;
                        std::__cxx11::string::string(in_stack_ffffffffffffeff0);
                        std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)&dump_file,(string *)in_stack_fffffffffffff028.lit,
                                   '\n');
                        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)CONCAT44(in_stack_ffffffffffffefec,iVar12),
                                                (char *)CONCAT17(in_stack_ffffffffffffefe7,
                                                                 CONCAT16(in_stack_ffffffffffffefe6,
                                                                          CONCAT15(
                                                  in_stack_ffffffffffffefe5,
                                                  in_stack_ffffffffffffefe0))));
                        in_stack_fffffffffffff024 = CONCAT13(bVar3,(int3)in_stack_fffffffffffff024);
                        if (bVar3) {
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_ffffffffffffefff,
                                                 CONCAT16(in_stack_ffffffffffffeffe,
                                                          CONCAT24(in_stack_ffffffffffffeffc,
                                                                   in_stack_ffffffffffffeff8))));
                          hex_str._M_str._0_4_ = in_stack_fffffffffffff048;
                          hex_str._M_len = (size_t)pWVar10;
                          hex_str._M_str._4_4_ = DVar8;
                          ParseHex<unsigned_char>(hex_str);
                          in_stack_fffffffffffff018 =
                               (ArgsManager *)
                               std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          CONCAT44(in_stack_ffffffffffffefdc,
                                                   in_stack_ffffffffffffefd8));
                          in_stack_fffffffffffff020 = base_blob<256U>::size();
                          if (in_stack_fffffffffffff018 ==
                              (ArgsManager *)(ulong)in_stack_fffffffffffff020) {
                            __last._M_current = (uchar *)&parsed_checksum;
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       CONCAT17(in_stack_ffffffffffffefe7,
                                                CONCAT16(in_stack_ffffffffffffefe6,
                                                         CONCAT15(in_stack_ffffffffffffefe5,
                                                                  in_stack_ffffffffffffefe0))));
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       CONCAT17(in_stack_ffffffffffffefe7,
                                                CONCAT16(in_stack_ffffffffffffefe6,
                                                         CONCAT15(in_stack_ffffffffffffefe5,
                                                                  in_stack_ffffffffffffefe0))));
                            in_stack_fffffffffffff008._M_current =
                                 base_blob<256U>::begin
                                           ((base_blob<256U> *)
                                            CONCAT44(in_stack_ffffffffffffefdc,
                                                     in_stack_ffffffffffffefd8));
                            std::
                            copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
                                      (in_stack_fffffffffffff008,__last,
                                       (uchar *)CONCAT44(in_stack_ffffffffffffefec,iVar12));
                          }
                          else {
                            in_stack_fffffffffffff010 = (string *)&local_d21;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffff028.lit,
                                       (char *)CONCAT44(in_stack_fffffffffffff024,
                                                        in_stack_fffffffffffff020),
                                       (allocator<char> *)in_stack_fffffffffffff018);
                            Untranslated(in_stack_fffffffffffff010);
                            bilingual_str::operator=
                                      ((bilingual_str *)CONCAT44(in_stack_ffffffffffffefec,iVar12),
                                       (bilingual_str *)
                                       CONCAT17(in_stack_ffffffffffffefe7,
                                                CONCAT16(in_stack_ffffffffffffefe6,
                                                         CONCAT15(in_stack_ffffffffffffefe5,
                                                                  in_stack_ffffffffffffefe0))));
                            bilingual_str::~bilingual_str
                                      ((bilingual_str *)
                                       CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8)
                                      );
                            std::__cxx11::string::~string
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffefdc,
                                                   in_stack_ffffffffffffefd8));
                            std::allocator<char>::~allocator((allocator<char> *)&local_d21);
                            bVar2 = 0;
                          }
                          local_df4 = 3;
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     CONCAT44(in_stack_ffffffffffffefec,iVar12));
                        }
                        else {
                          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                                    ((char *)in_stack_fffffffffffff018,in_stack_fffffffffffff010,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff008._M_current);
                          Span<char>::Span<std::__cxx11::string>
                                    ((Span<char> *)CONCAT44(in_stack_ffffffffffffefec,iVar12),
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT17(in_stack_ffffffffffffefe7,
                                                 CONCAT16(in_stack_ffffffffffffefe6,
                                                          CONCAT15(in_stack_ffffffffffffefe5,
                                                                   in_stack_ffffffffffffefe0))),
                                     (type)CONCAT44(in_stack_ffffffffffffefdc,
                                                    in_stack_ffffffffffffefd8));
                          HashWriter::operator<<
                                    ((HashWriter *)CONCAT44(in_stack_ffffffffffffefec,iVar12),
                                     (Span<char> *)
                                     CONCAT17(in_stack_ffffffffffffefe7,
                                              CONCAT16(in_stack_ffffffffffffefe6,
                                                       CONCAT15(in_stack_ffffffffffffefe5,
                                                                in_stack_ffffffffffffefe0))));
                          bVar3 = std::__cxx11::
                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT44(in_stack_ffffffffffffefdc,
                                                      in_stack_ffffffffffffefd8));
                          if ((bVar3) ||
                             (bVar3 = std::__cxx11::
                                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      ::empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT44(in_stack_ffffffffffffefdc,
                                                          in_stack_ffffffffffffefd8)), bVar3)) {
                            local_df4 = 2;
                          }
                          else {
                            std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT17(in_stack_ffffffffffffefff,
                                                   CONCAT16(in_stack_ffffffffffffeffe,
                                                            CONCAT24(in_stack_ffffffffffffeffc,
                                                                     in_stack_ffffffffffffeff8))));
                            str_00._M_str = (char *)in_stack_fffffffffffff008._M_current;
                            str_00._M_len = (size_t)__last._M_current;
                            in_stack_ffffffffffffefff = IsHex(str_00);
                            if ((bool)in_stack_ffffffffffffefff) {
                              std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT17(in_stack_ffffffffffffefff,
                                                     CONCAT16(in_stack_ffffffffffffeffe,
                                                              CONCAT24(in_stack_ffffffffffffeffc,
                                                                       in_stack_ffffffffffffeff8))))
                              ;
                              str_01._M_str = (char *)in_stack_fffffffffffff008._M_current;
                              str_01._M_len = (size_t)__last._M_current;
                              in_stack_ffffffffffffeffe = IsHex(str_01);
                              if ((bool)in_stack_ffffffffffffeffe) {
                                std::__cxx11::string::operator_cast_to_basic_string_view
                                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)CONCAT17(in_stack_ffffffffffffefff,
                                                       CONCAT16(in_stack_ffffffffffffeffe,
                                                                CONCAT24(in_stack_ffffffffffffeffc,
                                                                         in_stack_ffffffffffffeff8))
                                                      ));
                                hex_str_00._M_str._0_4_ = in_stack_fffffffffffff048;
                                hex_str_00._M_len = (size_t)pWVar10;
                                hex_str_00._M_str._4_4_ = DVar8;
                                ParseHex<unsigned_char>(hex_str_00);
                                std::__cxx11::string::operator_cast_to_basic_string_view
                                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)CONCAT17(in_stack_ffffffffffffefff,
                                                       CONCAT16(in_stack_ffffffffffffeffe,
                                                                CONCAT24(in_stack_ffffffffffffeffc,
                                                                         in_stack_ffffffffffffeff8))
                                                      ));
                                hex_str_01._M_str._0_4_ = in_stack_fffffffffffff048;
                                hex_str_01._M_len = (size_t)pWVar10;
                                hex_str_01._M_str._4_4_ = DVar8;
                                ParseHex<unsigned_char>(hex_str_01);
                                in_stack_ffffffffffffeff0 =
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)std::
                                        unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                        ::operator->((
                                                  unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                                  *)CONCAT44(in_stack_ffffffffffffefdc,
                                                             in_stack_ffffffffffffefd8));
                                Span<unsigned_char>::
                                Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                          ((Span<unsigned_char> *)
                                           CONCAT44(in_stack_ffffffffffffefec,iVar12),
                                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           CONCAT17(in_stack_ffffffffffffefe7,
                                                    CONCAT16(in_stack_ffffffffffffefe6,
                                                             CONCAT15(in_stack_ffffffffffffefe5,
                                                                      in_stack_ffffffffffffefe0))),
                                           (type)CONCAT44(in_stack_ffffffffffffefdc,
                                                          in_stack_ffffffffffffefd8));
                                Span<unsigned_char>::
                                Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                          ((Span<unsigned_char> *)
                                           CONCAT44(in_stack_ffffffffffffefec,iVar12),
                                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           CONCAT17(in_stack_ffffffffffffefe7,
                                                    CONCAT16(in_stack_ffffffffffffefe6,
                                                             CONCAT15(in_stack_ffffffffffffefe5,
                                                                      in_stack_ffffffffffffefe0))),
                                           (type)CONCAT44(in_stack_ffffffffffffefdc,
                                                          in_stack_ffffffffffffefd8));
                                bVar3 = DatabaseBatch::
                                        Write<Span<unsigned_char>,Span<unsigned_char>>
                                                  ((DatabaseBatch *)in_stack_fffffffffffff028.lit,
                                                   (Span<unsigned_char> *)
                                                   CONCAT44(in_stack_fffffffffffff024,
                                                            in_stack_fffffffffffff020),
                                                   (Span<unsigned_char> *)in_stack_fffffffffffff018,
                                                   SUB81((ulong)in_stack_fffffffffffff010 >> 0x38,0)
                                                  );
                                in_stack_ffffffffffffefec =
                                     CONCAT13(bVar3,(int3)in_stack_ffffffffffffefec);
                                if (((bVar3 ^ 0xffU) & 1) == 0) {
                                  local_df4 = 0;
                                }
                                else {
                                  _(in_stack_fffffffffffff028);
                                  tinyformat::format<>
                                            ((bilingual_str *)in_stack_fffffffffffff008._M_current);
                                  bilingual_str::operator=
                                            ((bilingual_str *)
                                             CONCAT44(in_stack_ffffffffffffefec,iVar12),
                                             (bilingual_str *)
                                             CONCAT17(in_stack_ffffffffffffefe7,
                                                      CONCAT16(in_stack_ffffffffffffefe6,
                                                               CONCAT15(in_stack_ffffffffffffefe5,
                                                                        in_stack_ffffffffffffefe0)))
                                            );
                                  bilingual_str::~bilingual_str
                                            ((bilingual_str *)
                                             CONCAT44(in_stack_ffffffffffffefdc,
                                                      in_stack_ffffffffffffefd8));
                                  bilingual_str::~bilingual_str
                                            ((bilingual_str *)
                                             CONCAT44(in_stack_ffffffffffffefdc,
                                                      in_stack_ffffffffffffefd8));
                                  bVar2 = 0;
                                  local_df4 = 3;
                                }
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           CONCAT44(in_stack_ffffffffffffefec,iVar12));
                                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           CONCAT44(in_stack_ffffffffffffefec,iVar12));
                              }
                              else {
                                _(in_stack_fffffffffffff028);
                                tinyformat::format<std::__cxx11::string>
                                          ((bilingual_str *)
                                           CONCAT17(bVar7,in_stack_fffffffffffff038),psVar13);
                                bilingual_str::operator=
                                          ((bilingual_str *)
                                           CONCAT44(in_stack_ffffffffffffefec,iVar12),
                                           (bilingual_str *)
                                           CONCAT17(in_stack_ffffffffffffefe7,
                                                    CONCAT16(in_stack_ffffffffffffefe6,
                                                             CONCAT15(in_stack_ffffffffffffefe5,
                                                                      in_stack_ffffffffffffefe0))));
                                bilingual_str::~bilingual_str
                                          ((bilingual_str *)
                                           CONCAT44(in_stack_ffffffffffffefdc,
                                                    in_stack_ffffffffffffefd8));
                                bilingual_str::~bilingual_str
                                          ((bilingual_str *)
                                           CONCAT44(in_stack_ffffffffffffefdc,
                                                    in_stack_ffffffffffffefd8));
                                bVar2 = 0;
                                local_df4 = 3;
                              }
                            }
                            else {
                              _(in_stack_fffffffffffff028);
                              tinyformat::format<std::__cxx11::string>
                                        ((bilingual_str *)CONCAT17(bVar7,in_stack_fffffffffffff038),
                                         psVar13);
                              bilingual_str::operator=
                                        ((bilingual_str *)CONCAT44(in_stack_ffffffffffffefec,iVar12)
                                         ,(bilingual_str *)
                                          CONCAT17(in_stack_ffffffffffffefe7,
                                                   CONCAT16(in_stack_ffffffffffffefe6,
                                                            CONCAT15(in_stack_ffffffffffffefe5,
                                                                     in_stack_ffffffffffffefe0))));
                              bilingual_str::~bilingual_str
                                        ((bilingual_str *)
                                         CONCAT44(in_stack_ffffffffffffefdc,
                                                  in_stack_ffffffffffffefd8));
                              bilingual_str::~bilingual_str
                                        ((bilingual_str *)
                                         CONCAT44(in_stack_ffffffffffffefdc,
                                                  in_stack_ffffffffffffefd8));
                              bVar2 = 0;
                              local_df4 = 3;
                            }
                          }
                          std::__cxx11::string::~string
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8
                                                ));
                        }
                        std::__cxx11::string::~string
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8))
                        ;
                        std::__cxx11::string::~string
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8))
                        ;
                        iVar12 = local_df4;
                      } while ((local_df4 == 0) || (local_df4 == 2));
                      if (bVar2 != 0) {
                        HashWriter::GetHash((HashWriter *)
                                            CONCAT17(in_stack_ffffffffffffefff,
                                                     CONCAT16(in_stack_ffffffffffffeffe,
                                                              CONCAT24(in_stack_ffffffffffffeffc,
                                                                       in_stack_ffffffffffffeff8))))
                        ;
                        uVar4 = base_blob<256U>::IsNull
                                          ((base_blob<256U> *)
                                           CONCAT44(in_stack_ffffffffffffefec,local_df4));
                        if ((bool)uVar4) {
                          _(in_stack_fffffffffffff028);
                          bilingual_str::operator=
                                    ((bilingual_str *)CONCAT44(in_stack_ffffffffffffefec,local_df4),
                                     (bilingual_str *)
                                     CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffefe6,
                                                             CONCAT15(in_stack_ffffffffffffefe5,
                                                                      in_stack_ffffffffffffefe0))));
                          bilingual_str::~bilingual_str
                                    ((bilingual_str *)
                                     CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
                          bVar2 = 0;
                        }
                        else {
                          uVar6 = ::operator!=((base_blob<256U> *)
                                               CONCAT44(in_stack_ffffffffffffefec,local_df4),
                                               (base_blob<256U> *)
                                               CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffefe6,
                                                                       CONCAT15(
                                                  in_stack_ffffffffffffefe5,
                                                  in_stack_ffffffffffffefe0))));
                          if ((bool)uVar6) {
                            _(in_stack_fffffffffffff028);
                            Span<const_unsigned_char>::Span<uint256>
                                      ((Span<const_unsigned_char> *)
                                       CONCAT44(in_stack_ffffffffffffefec,local_df4),
                                       (uint256 *)
                                       CONCAT17(uVar4,CONCAT16(uVar6,CONCAT15(
                                                  in_stack_ffffffffffffefe5,
                                                  in_stack_ffffffffffffefe0))),
                                       (type)CONCAT44(in_stack_ffffffffffffefdc,
                                                      in_stack_ffffffffffffefd8));
                            s.m_size = (size_t)pvVar9;
                            s.m_data = puVar14;
                            HexStr_abi_cxx11_(s);
                            Span<const_unsigned_char>::Span<uint256>
                                      ((Span<const_unsigned_char> *)
                                       CONCAT44(in_stack_ffffffffffffefec,local_df4),
                                       (uint256 *)
                                       CONCAT17(uVar4,CONCAT16(uVar6,CONCAT15(
                                                  in_stack_ffffffffffffefe5,
                                                  in_stack_ffffffffffffefe0))),
                                       (type)CONCAT44(in_stack_ffffffffffffefdc,
                                                      in_stack_ffffffffffffefd8));
                            s_00.m_size = (size_t)pvVar9;
                            s_00.m_data = puVar14;
                            HexStr_abi_cxx11_(s_00);
                            tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                                      ((bilingual_str *)name,args_00,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(DVar8,in_stack_fffffffffffff048));
                            bilingual_str::operator=
                                      ((bilingual_str *)
                                       CONCAT44(in_stack_ffffffffffffefec,local_df4),
                                       (bilingual_str *)
                                       CONCAT17(uVar4,CONCAT16(uVar6,CONCAT15(
                                                  in_stack_ffffffffffffefe5,
                                                  in_stack_ffffffffffffefe0))));
                            bilingual_str::~bilingual_str
                                      ((bilingual_str *)
                                       CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8)
                                      );
                            std::__cxx11::string::~string
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffefdc,
                                                   in_stack_ffffffffffffefd8));
                            std::__cxx11::string::~string
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_ffffffffffffefdc,
                                                   in_stack_ffffffffffffefd8));
                            bilingual_str::~bilingual_str
                                      ((bilingual_str *)
                                       CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8)
                                      );
                            bVar2 = 0;
                          }
                        }
                      }
                      if (bVar2 == 0) {
                        pDVar11 = std::
                                  unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                  ::operator->((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                                *)CONCAT44(in_stack_ffffffffffffefdc,
                                                           in_stack_ffffffffffffefd8));
                        (*pDVar11->_vptr_DatabaseBatch[0xd])();
                      }
                      else {
                        pDVar11 = std::
                                  unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                  ::operator->((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                                *)CONCAT44(in_stack_ffffffffffffefdc,
                                                           in_stack_ffffffffffffefd8));
                        (*pDVar11->_vptr_DatabaseBatch[0xc])();
                      }
                      std::
                      unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                      ::reset((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                               *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8),
                              (pointer)0x18eedb);
                      std::ifstream::close();
                      std::
                      unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                      ::~unique_ptr((unique_ptr<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                     *)CONCAT44(in_stack_ffffffffffffefec,local_df4));
                      bVar3 = false;
                    }
                    else {
                      _(in_stack_fffffffffffff028);
                      tinyformat::format<std::__cxx11::string>
                                ((bilingual_str *)
                                 CONCAT17(in_stack_fffffffffffff03f,in_stack_fffffffffffff038),
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff030);
                      bilingual_str::operator=
                                ((bilingual_str *)CONCAT44(in_stack_ffffffffffffefec,local_df4),
                                 (bilingual_str *)
                                 CONCAT17(in_stack_ffffffffffffefe7,
                                          CONCAT16(in_stack_ffffffffffffefe6,
                                                   CONCAT15(in_stack_ffffffffffffefe5,
                                                            in_stack_ffffffffffffefe0))));
                      bilingual_str::~bilingual_str
                                ((bilingual_str *)
                                 CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
                      bilingual_str::~bilingual_str
                                ((bilingual_str *)
                                 CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
                      local_da9 = 0;
                      bVar3 = true;
                    }
                    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                               CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
                    if ((!bVar3) &&
                       (std::__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>::reset
                                  ((__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)
                                   CONCAT44(in_stack_ffffffffffffefec,local_df4)), local_da9 = bVar2
                       , bVar2 == 0)) {
                      std::filesystem::remove_all(&wallet_path->super_path);
                    }
                    std::shared_ptr<wallet::CWallet>::~shared_ptr
                              ((shared_ptr<wallet::CWallet> *)
                               CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
                  }
                  else {
                    local_da9 = 0;
                  }
                  std::
                  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::
                  ~unique_ptr((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                               *)CONCAT44(in_stack_ffffffffffffefec,local_df4));
                  DatabaseOptions::~DatabaseOptions
                            ((DatabaseOptions *)
                             CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
                }
                else {
                  _(in_stack_fffffffffffff028);
                  tinyformat::format<std::__cxx11::string>
                            ((bilingual_str *)
                             CONCAT17(in_stack_fffffffffffff03f,in_stack_fffffffffffff038),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff030);
                  bilingual_str::operator=
                            ((bilingual_str *)
                             CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                             (bilingual_str *)
                             CONCAT17(in_stack_ffffffffffffefe7,
                                      CONCAT16(in_stack_ffffffffffffefe6,
                                               CONCAT15(in_stack_ffffffffffffefe5,
                                                        in_stack_ffffffffffffefe0))));
                  bilingual_str::~bilingual_str
                            ((bilingual_str *)
                             CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
                  bilingual_str::~bilingual_str
                            ((bilingual_str *)
                             CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
                  local_da9 = 0;
                }
              }
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
            }
            else {
              _(in_stack_fffffffffffff028);
              tinyformat::format<std::__cxx11::string>
                        ((bilingual_str *)
                         CONCAT17(in_stack_fffffffffffff03f,in_stack_fffffffffffff038),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff030);
              bilingual_str::operator=
                        ((bilingual_str *)
                         CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                         (bilingual_str *)
                         CONCAT17(in_stack_ffffffffffffefe7,
                                  CONCAT16(in_stack_ffffffffffffefe6,
                                           CONCAT15(in_stack_ffffffffffffefe5,
                                                    in_stack_ffffffffffffefe0))));
              bilingual_str::~bilingual_str
                        ((bilingual_str *)
                         CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
              bilingual_str::~bilingual_str
                        ((bilingual_str *)
                         CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
              std::ifstream::close();
              local_da9 = 0;
            }
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
          }
          else {
            _(in_stack_fffffffffffff028);
            tinyformat::format<std::__cxx11::string>
                      ((bilingual_str *)
                       CONCAT17(in_stack_fffffffffffff03f,in_stack_fffffffffffff038),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff030);
            bilingual_str::operator=
                      ((bilingual_str *)
                       CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                       (bilingual_str *)
                       CONCAT17(in_stack_ffffffffffffefe7,
                                CONCAT16(in_stack_ffffffffffffefe6,
                                         CONCAT15(in_stack_ffffffffffffefe5,
                                                  in_stack_ffffffffffffefe0))));
            bilingual_str::~bilingual_str
                      ((bilingual_str *)
                       CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
            bilingual_str::~bilingual_str
                      ((bilingual_str *)
                       CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
            std::ifstream::close();
            local_da9 = 0;
          }
        }
        else {
          _(in_stack_fffffffffffff028);
          tinyformat::format<std::__cxx11::string>
                    ((bilingual_str *)CONCAT17(in_stack_fffffffffffff03f,in_stack_fffffffffffff038),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff030);
          bilingual_str::operator=
                    ((bilingual_str *)CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                     (bilingual_str *)
                     CONCAT17(in_stack_ffffffffffffefe7,
                              CONCAT16(in_stack_ffffffffffffefe6,
                                       CONCAT15(in_stack_ffffffffffffefe5,in_stack_ffffffffffffefe0)
                                      )));
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8))
          ;
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8))
          ;
          std::ifstream::close();
          local_da9 = 0;
        }
      }
      else {
        _(in_stack_fffffffffffff028);
        tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                  (in_stack_fffffffffffff058,in_stack_fffffffffffff050,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff04c,in_stack_fffffffffffff048));
        bilingual_str::operator=
                  ((bilingual_str *)CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                   (bilingual_str *)
                   CONCAT17(in_stack_ffffffffffffefe7,
                            CONCAT16(in_stack_ffffffffffffefe6,
                                     CONCAT15(in_stack_ffffffffffffefe5,in_stack_ffffffffffffefe0)))
                  );
        bilingual_str::~bilingual_str
                  ((bilingual_str *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
        bilingual_str::~bilingual_str
                  ((bilingual_str *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
        std::ifstream::close();
        local_da9 = 0;
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
      std::ifstream::~ifstream(&dump_file);
    }
    else {
      _(in_stack_fffffffffffff028);
      fs::PathToString_abi_cxx11_
                ((path *)CONCAT17(in_stack_ffffffffffffefe7,
                                  CONCAT16(in_stack_ffffffffffffefe6,
                                           CONCAT15(in_stack_ffffffffffffefe5,
                                                    in_stack_ffffffffffffefe0))));
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)CONCAT17(in_stack_fffffffffffff03f,in_stack_fffffffffffff038),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff030);
      bilingual_str::operator=
                ((bilingual_str *)CONCAT44(in_stack_ffffffffffffefec,in_stack_ffffffffffffefe8),
                 (bilingual_str *)
                 CONCAT17(in_stack_ffffffffffffefe7,
                          CONCAT16(in_stack_ffffffffffffefe6,
                                   CONCAT15(in_stack_ffffffffffffefe5,in_stack_ffffffffffffefe0))));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
      local_da9 = 0;
    }
    fs::path::~path((path *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_da9 & 1);
}

Assistant:

bool CreateFromDump(const ArgsManager& args, const std::string& name, const fs::path& wallet_path, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    // Get the dumpfile
    std::string dump_filename = args.GetArg("-dumpfile", "");
    if (dump_filename.empty()) {
        error = _("No dump file provided. To use createfromdump, -dumpfile=<filename> must be provided.");
        return false;
    }

    fs::path dump_path = fs::PathFromString(dump_filename);
    dump_path = fs::absolute(dump_path);
    if (!fs::exists(dump_path)) {
        error = strprintf(_("Dump file %s does not exist."), fs::PathToString(dump_path));
        return false;
    }
    std::ifstream dump_file{dump_path};

    // Compute the checksum
    HashWriter hasher{};
    uint256 checksum;

    // Check the magic and version
    std::string magic_key;
    std::getline(dump_file, magic_key, ',');
    std::string version_value;
    std::getline(dump_file, version_value, '\n');
    if (magic_key != DUMP_MAGIC) {
        error = strprintf(_("Error: Dumpfile identifier record is incorrect. Got \"%s\", expected \"%s\"."), magic_key, DUMP_MAGIC);
        dump_file.close();
        return false;
    }
    // Check the version number (value of first record)
    uint32_t ver;
    if (!ParseUInt32(version_value, &ver)) {
        error =strprintf(_("Error: Unable to parse version %u as a uint32_t"), version_value);
        dump_file.close();
        return false;
    }
    if (ver != DUMP_VERSION) {
        error = strprintf(_("Error: Dumpfile version is not supported. This version of bitcoin-wallet only supports version 1 dumpfiles. Got dumpfile with version %s"), version_value);
        dump_file.close();
        return false;
    }
    std::string magic_hasher_line = strprintf("%s,%s\n", magic_key, version_value);
    hasher << Span{magic_hasher_line};

    // Get the stored file format
    std::string format_key;
    std::getline(dump_file, format_key, ',');
    std::string format_value;
    std::getline(dump_file, format_value, '\n');
    if (format_key != "format") {
        error = strprintf(_("Error: Dumpfile format record is incorrect. Got \"%s\", expected \"format\"."), format_key);
        dump_file.close();
        return false;
    }
    // Get the data file format with format_value as the default
    std::string file_format = args.GetArg("-format", format_value);
    if (file_format.empty()) {
        error = _("No wallet file format provided. To use createfromdump, -format=<format> must be provided.");
        return false;
    }
    DatabaseFormat data_format;
    if (file_format == "bdb") {
        data_format = DatabaseFormat::BERKELEY;
    } else if (file_format == "sqlite") {
        data_format = DatabaseFormat::SQLITE;
    } else if (file_format == "bdb_swap") {
        data_format = DatabaseFormat::BERKELEY_SWAP;
    } else {
        error = strprintf(_("Unknown wallet file format \"%s\" provided. Please provide one of \"bdb\" or \"sqlite\"."), file_format);
        return false;
    }
    if (file_format != format_value) {
        warnings.push_back(strprintf(_("Warning: Dumpfile wallet format \"%s\" does not match command line specified format \"%s\"."), format_value, file_format));
    }
    std::string format_hasher_line = strprintf("%s,%s\n", format_key, format_value);
    hasher << Span{format_hasher_line};

    DatabaseOptions options;
    DatabaseStatus status;
    ReadDatabaseArgs(args, options);
    options.require_create = true;
    options.require_format = data_format;
    std::unique_ptr<WalletDatabase> database = MakeDatabase(wallet_path, options, status, error);
    if (!database) return false;

    // dummy chain interface
    bool ret = true;
    std::shared_ptr<CWallet> wallet(new CWallet(/*chain=*/nullptr, name, std::move(database)), WalletToolReleaseWallet);
    {
        LOCK(wallet->cs_wallet);
        DBErrors load_wallet_ret = wallet->LoadWallet();
        if (load_wallet_ret != DBErrors::LOAD_OK) {
            error = strprintf(_("Error creating %s"), name);
            return false;
        }

        // Get the database handle
        WalletDatabase& db = wallet->GetDatabase();
        std::unique_ptr<DatabaseBatch> batch = db.MakeBatch();
        batch->TxnBegin();

        // Read the records from the dump file and write them to the database
        while (dump_file.good()) {
            std::string key;
            std::getline(dump_file, key, ',');
            std::string value;
            std::getline(dump_file, value, '\n');

            if (key == "checksum") {
                std::vector<unsigned char> parsed_checksum = ParseHex(value);
                if (parsed_checksum.size() != checksum.size()) {
                    error = Untranslated("Error: Checksum is not the correct size");
                    ret = false;
                    break;
                }
                std::copy(parsed_checksum.begin(), parsed_checksum.end(), checksum.begin());
                break;
            }

            std::string line = strprintf("%s,%s\n", key, value);
            hasher << Span{line};

            if (key.empty() || value.empty()) {
                continue;
            }

            if (!IsHex(key)) {
                error = strprintf(_("Error: Got key that was not hex: %s"), key);
                ret = false;
                break;
            }
            if (!IsHex(value)) {
                error = strprintf(_("Error: Got value that was not hex: %s"), value);
                ret = false;
                break;
            }

            std::vector<unsigned char> k = ParseHex(key);
            std::vector<unsigned char> v = ParseHex(value);
            if (!batch->Write(Span{k}, Span{v})) {
                error = strprintf(_("Error: Unable to write record to new wallet"));
                ret = false;
                break;
            }
        }

        if (ret) {
            uint256 comp_checksum = hasher.GetHash();
            if (checksum.IsNull()) {
                error = _("Error: Missing checksum");
                ret = false;
            } else if (checksum != comp_checksum) {
                error = strprintf(_("Error: Dumpfile checksum does not match. Computed %s, expected %s"), HexStr(comp_checksum), HexStr(checksum));
                ret = false;
            }
        }

        if (ret) {
            batch->TxnCommit();
        } else {
            batch->TxnAbort();
        }

        batch.reset();

        dump_file.close();
    }
    wallet.reset(); // The pointer deleter will close the wallet for us.

    // Remove the wallet dir if we have a failure
    if (!ret) {
        fs::remove_all(wallet_path);
    }

    return ret;
}